

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::JointAOHIndexToIndividualActionObservationVectors
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *indivO_vec,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *indivA_vec)

{
  _func_int *p_Var1;
  long lVar2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  undefined8 uStackY_190;
  value_type local_188;
  value_type local_184;
  undefined8 local_180;
  ulong local_178;
  undefined1 *local_170 [3];
  ulong local_158;
  LIndex in_stack_fffffffffffffeb0;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffeb8;
  PlanningUnitMADPDiscrete *local_130 [2];
  undefined8 local_120;
  undefined1 *local_118;
  uint local_10c;
  undefined1 local_108 [4];
  Index agentI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivO_IndicesThisT;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivA_IndicesThisT;
  undefined1 local_ce [2];
  Index ts;
  undefined1 local_85;
  undefined4 local_84;
  undefined1 local_68 [24];
  undefined8 local_50;
  size_t nrAgents;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  Index local_2c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvStack_28;
  Index t;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *indivA_vec_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *indivO_vec_local;
  LIndex jaohI_local;
  PlanningUnitMADPDiscrete *this_local;
  
  uStackY_190 = 0x9d78af;
  local_130[0] = this;
  pvStack_28 = indivA_vec;
  indivA_vec_local = indivO_vec;
  indivO_vec_local =
       (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        *)jaohI;
  jaohI_local = (LIndex)this;
  local_2c = GetTimeStepForJAOHI(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  __vla_expr0 = (unsigned_long)&local_188;
  __vla_expr1 = (ulong)local_2c;
  lVar2 = (-0x188 - ((ulong)local_2c * 4 + 0xf & 0xfffffffffffffff0)) -
          ((ulong)local_2c * 4 + 0xf & 0xfffffffffffffff0);
  nrAgents = (ulong)local_2c;
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7912;
  GetJointActionObservationHistoryArrays
            (*(PlanningUnitMADPDiscrete **)(&stack0xfffffffffffffef0 + lVar2 + 0x188),
             *(LIndex *)((long)&local_118 + lVar2 + 0x188),
             *(Index *)((long)&local_120 + lVar2 + 0x18c),*(Index **)((long)local_130 + lVar2 + 400)
             ,*(Index **)((long)local_130 + lVar2 + 0x188));
  p_Var1 = (local_130[0]->super_PlanningUnit)._vptr_PlanningUnit[6];
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7922;
  iVar4 = (*p_Var1)();
  local_50 = CONCAT44(extraout_var,iVar4);
  local_130[1] = (PlanningUnitMADPDiscrete *)CONCAT44(extraout_var,iVar4);
  local_120 = (ulong)local_2c;
  local_84 = 0;
  local_118 = &local_85;
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7952;
  std::allocator<unsigned_int>::allocator
            (*(allocator<unsigned_int> **)((long)&uStackY_190 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d796d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              ((long)local_170 + lVar2 + 0x198),*(size_type *)((long)local_170 + lVar2 + 400),
             *(value_type_conflict1 **)((long)local_170 + lVar2 + 0x188),
             *(allocator_type **)((long)&local_178 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7982;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            (*(allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> **)
              ((long)&uStackY_190 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d799d;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             **)((long)local_170 + lVar2 + 0x198),*(size_type *)((long)local_170 + lVar2 + 400),
           *(value_type **)((long)local_170 + lVar2 + 0x188),
           *(allocator_type **)((long)&local_178 + lVar2 + 0x188));
  local_170[1] = local_68;
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d79b3;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                **)((long)local_170 + lVar2 + 0x188),
              *(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                **)((long)&local_178 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d79bf;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              **)((long)local_170 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d79cb;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            (*(allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> **)
              ((long)&uStackY_190 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d79d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              ((long)local_170 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d79dd;
  std::allocator<unsigned_int>::~allocator
            (*(allocator<unsigned_int> **)((long)&uStackY_190 + lVar2 + 0x188));
  local_170[2] = (undefined1 *)local_50;
  local_158 = (ulong)local_2c;
  ts = 0;
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a0f;
  std::allocator<unsigned_int>::allocator
            (*(allocator<unsigned_int> **)((long)&uStackY_190 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a30;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              ((long)local_170 + lVar2 + 0x198),*(size_type *)((long)local_170 + lVar2 + 400),
             *(value_type_conflict1 **)((long)local_170 + lVar2 + 0x188),
             *(allocator_type **)((long)&local_178 + lVar2 + 0x188));
  local_170[0] = local_ce;
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a45;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            (*(allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> **)
              ((long)&uStackY_190 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a66;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             **)((long)local_170 + lVar2 + 0x198),*(size_type *)((long)local_170 + lVar2 + 400),
           *(value_type **)((long)local_170 + lVar2 + 0x188),
           *(allocator_type **)((long)&local_178 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a78;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                **)((long)local_170 + lVar2 + 0x188),
              *(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                **)((long)&local_178 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a84;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              **)((long)local_170 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a90;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            (*(allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> **)
              ((long)&uStackY_190 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7a9c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
              ((long)local_170 + lVar2 + 0x188));
  *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7aa8;
  std::allocator<unsigned_int>::~allocator
            (*(allocator<unsigned_int> **)((long)&uStackY_190 + lVar2 + 0x188));
  for (indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < local_2c;
      indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7ae4;
    JointToIndividualActionIndices
              (*(PlanningUnitMADPDiscrete **)((long)&local_178 + lVar2 + 0x188),
               *(Index *)((long)&local_180 + lVar2 + 0x18c));
    *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7b07;
    JointToIndividualObservationIndices
              (*(PlanningUnitMADPDiscrete **)((long)&local_178 + lVar2 + 0x188),
               *(Index *)((long)&local_180 + lVar2 + 0x18c));
    local_10c = 0;
    while( true ) {
      local_180 = (ulong)local_10c;
      p_Var1 = (local_130[0]->super_PlanningUnit)._vptr_PlanningUnit[6];
      *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7b30;
      iVar4 = (*p_Var1)();
      local_178 = CONCAT44(extraout_var_00,iVar4);
      if (CONCAT44(extraout_var_00,iVar4) <= local_180) break;
      uVar7 = (ulong)local_10c;
      *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7b64;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,uVar7);
      pvVar3 = indivA_vec_local;
      local_188 = *pvVar5;
      uVar7 = (ulong)local_10c;
      *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7b7d;
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar3,uVar7);
      *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7b8d;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(ulong)indivA_IndicesThisT.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar5 = local_188;
      uVar7 = (ulong)local_10c;
      *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7ba9;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &indivO_IndicesThisT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,uVar7);
      pvVar3 = pvStack_28;
      local_184 = *pvVar5;
      uVar7 = (ulong)local_10c;
      *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7bc2;
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar3,uVar7);
      *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7bd2;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar6,(ulong)indivA_IndicesThisT.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar5 = local_184;
      local_10c = local_10c + 1;
    }
    *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7cc3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                ((long)local_170 + lVar2 + 0x188));
    *(undefined8 *)((long)&uStackY_190 + lVar2 + 0x188) = 0x9d7ccf;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                ((long)local_170 + lVar2 + 0x188));
  }
  return;
}

Assistant:

void
PlanningUnitMADPDiscrete::JointAOHIndexToIndividualActionObservationVectors(
        LIndex jaohI,
        vector< vector<Index> >& indivO_vec,
        vector< vector<Index> >& indivA_vec
        ) const
{
    Index t = GetTimeStepForJAOHI(jaohI);
    Index jo_array[t];
    Index ja_array[t];

    GetJointActionObservationHistoryArrays(jaohI, t, ja_array, jo_array);      

    size_t nrAgents = GetNrAgents();
    //convert joint observations -> indiv. observations
    //indivO_vec[agentI][t] = oI
    indivO_vec = vector< vector<Index> >(nrAgents, vector<Index>(t, 0));
    indivA_vec = vector< vector<Index> >(nrAgents, vector<Index>(t, 0));
    for (Index ts=0; ts<t; ts++)
    {
        vector<Index> indivA_IndicesThisT = 
            JointToIndividualActionIndices(ja_array[ts]);
        vector<Index> indivO_IndicesThisT = 
            JointToIndividualObservationIndices(jo_array[ts]);
        for (Index agentI=0; agentI<GetNrAgents(); agentI++)
        {
            indivO_vec[agentI][ts] = indivO_IndicesThisT[agentI];
            indivA_vec[agentI][ts] = indivA_IndicesThisT[agentI];
        }
    }
}